

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_gpu_multicast(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_gpu_multicast != 0) {
    glad_glRenderGpuMaskNV = (PFNGLRENDERGPUMASKNVPROC)(*load)("glRenderGpuMaskNV");
    glad_glMulticastBufferSubDataNV =
         (PFNGLMULTICASTBUFFERSUBDATANVPROC)(*load)("glMulticastBufferSubDataNV");
    glad_glMulticastCopyBufferSubDataNV =
         (PFNGLMULTICASTCOPYBUFFERSUBDATANVPROC)(*load)("glMulticastCopyBufferSubDataNV");
    glad_glMulticastCopyImageSubDataNV =
         (PFNGLMULTICASTCOPYIMAGESUBDATANVPROC)(*load)("glMulticastCopyImageSubDataNV");
    glad_glMulticastBlitFramebufferNV =
         (PFNGLMULTICASTBLITFRAMEBUFFERNVPROC)(*load)("glMulticastBlitFramebufferNV");
    glad_glMulticastFramebufferSampleLocationsfvNV =
         (PFNGLMULTICASTFRAMEBUFFERSAMPLELOCATIONSFVNVPROC)
         (*load)("glMulticastFramebufferSampleLocationsfvNV");
    glad_glMulticastBarrierNV = (PFNGLMULTICASTBARRIERNVPROC)(*load)("glMulticastBarrierNV");
    glad_glMulticastWaitSyncNV = (PFNGLMULTICASTWAITSYNCNVPROC)(*load)("glMulticastWaitSyncNV");
    glad_glMulticastGetQueryObjectivNV =
         (PFNGLMULTICASTGETQUERYOBJECTIVNVPROC)(*load)("glMulticastGetQueryObjectivNV");
    glad_glMulticastGetQueryObjectuivNV =
         (PFNGLMULTICASTGETQUERYOBJECTUIVNVPROC)(*load)("glMulticastGetQueryObjectuivNV");
    glad_glMulticastGetQueryObjecti64vNV =
         (PFNGLMULTICASTGETQUERYOBJECTI64VNVPROC)(*load)("glMulticastGetQueryObjecti64vNV");
    glad_glMulticastGetQueryObjectui64vNV =
         (PFNGLMULTICASTGETQUERYOBJECTUI64VNVPROC)(*load)("glMulticastGetQueryObjectui64vNV");
  }
  return;
}

Assistant:

static void load_GL_NV_gpu_multicast(GLADloadproc load) {
	if(!GLAD_GL_NV_gpu_multicast) return;
	glad_glRenderGpuMaskNV = (PFNGLRENDERGPUMASKNVPROC)load("glRenderGpuMaskNV");
	glad_glMulticastBufferSubDataNV = (PFNGLMULTICASTBUFFERSUBDATANVPROC)load("glMulticastBufferSubDataNV");
	glad_glMulticastCopyBufferSubDataNV = (PFNGLMULTICASTCOPYBUFFERSUBDATANVPROC)load("glMulticastCopyBufferSubDataNV");
	glad_glMulticastCopyImageSubDataNV = (PFNGLMULTICASTCOPYIMAGESUBDATANVPROC)load("glMulticastCopyImageSubDataNV");
	glad_glMulticastBlitFramebufferNV = (PFNGLMULTICASTBLITFRAMEBUFFERNVPROC)load("glMulticastBlitFramebufferNV");
	glad_glMulticastFramebufferSampleLocationsfvNV = (PFNGLMULTICASTFRAMEBUFFERSAMPLELOCATIONSFVNVPROC)load("glMulticastFramebufferSampleLocationsfvNV");
	glad_glMulticastBarrierNV = (PFNGLMULTICASTBARRIERNVPROC)load("glMulticastBarrierNV");
	glad_glMulticastWaitSyncNV = (PFNGLMULTICASTWAITSYNCNVPROC)load("glMulticastWaitSyncNV");
	glad_glMulticastGetQueryObjectivNV = (PFNGLMULTICASTGETQUERYOBJECTIVNVPROC)load("glMulticastGetQueryObjectivNV");
	glad_glMulticastGetQueryObjectuivNV = (PFNGLMULTICASTGETQUERYOBJECTUIVNVPROC)load("glMulticastGetQueryObjectuivNV");
	glad_glMulticastGetQueryObjecti64vNV = (PFNGLMULTICASTGETQUERYOBJECTI64VNVPROC)load("glMulticastGetQueryObjecti64vNV");
	glad_glMulticastGetQueryObjectui64vNV = (PFNGLMULTICASTGETQUERYOBJECTUI64VNVPROC)load("glMulticastGetQueryObjectui64vNV");
}